

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srho.hpp
# Opt level: O2

double wdm::impl::srho(vector<double,_std::allocator<double>_> *x,
                      vector<double,_std::allocator<double>_> *y,
                      vector<double,_std::allocator<double>_> *weights)

{
  allocator local_129;
  double local_128;
  _Vector_base<double,_std::allocator<double>_> local_120;
  _Vector_base<double,_std::allocator<double>_> local_108;
  _Vector_base<double,_std::allocator<double>_> local_f0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  string local_60;
  string local_40;
  
  utils::check_sizes(x,y,weights);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_90,x);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a8,weights);
  std::__cxx11::string::string((string *)&local_40,"average",&local_129);
  rank0((vector<double,_std::allocator<double>_> *)&local_78,
        (vector<double,_std::allocator<double>_> *)&local_90,
        (vector<double,_std::allocator<double>_> *)&local_a8,&local_40);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(x,&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_c0,y);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_d8,weights);
  std::__cxx11::string::string((string *)&local_60,"average",&local_129);
  rank0((vector<double,_std::allocator<double>_> *)&local_78,
        (vector<double,_std::allocator<double>_> *)&local_c0,
        (vector<double,_std::allocator<double>_> *)&local_d8,&local_60);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(y,&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_f0,x);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_108,y);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_120,weights);
  local_128 = prho((vector<double,_std::allocator<double>_> *)&local_f0,
                   (vector<double,_std::allocator<double>_> *)&local_108,
                   (vector<double,_std::allocator<double>_> *)&local_120);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f0);
  return local_128;
}

Assistant:

inline double srho(std::vector<double> x,
                   std::vector<double> y,
                   std::vector<double> weights = std::vector<double>())
{
    utils::check_sizes(x, y, weights);
    x = rank0(x, weights, "average");
    y = rank0(y, weights, "average");
    return prho(x, y, weights);
}